

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void ResetLine(TidyPrintImpl *pprint)

{
  uint uVar1;
  int iVar2;
  int wrap;
  int iVar3;
  
  if (pprint->ixInd != 0) {
    pprint->indent[0].attrStringStart = pprint->indent[1].attrStringStart;
    iVar2 = pprint->indent[1].attrValStart;
    pprint->indent[0].spaces = pprint->indent[1].spaces;
    pprint->indent[0].attrValStart = iVar2;
    pprint->indent[1].spaces = -1;
    pprint->indent[1].attrValStart = -1;
    pprint->indent[1].attrStringStart = -1;
  }
  uVar1 = pprint->wraphere;
  iVar2 = pprint->indent[0].attrStringStart;
  if (uVar1 == 0) {
    if (0 < iVar2) {
      pprint->indent[0].attrStringStart = 0;
    }
    if (0 < pprint->indent[0].attrValStart) {
      pprint->indent[0].attrValStart = 0;
    }
  }
  else {
    if (iVar2 - uVar1 != 0 && (int)uVar1 <= iVar2) {
      pprint->indent[0].attrStringStart = iVar2 - uVar1;
    }
    iVar2 = pprint->indent[0].attrValStart;
    iVar3 = iVar2 - uVar1;
    if (iVar3 != 0 && (int)uVar1 <= iVar2) {
      pprint->indent[0].attrValStart = iVar3;
    }
  }
  pprint->ixInd = 0;
  pprint->wraphere = 0;
  return;
}

Assistant:

static void ResetLine( TidyPrintImpl* pprint )
{
    TidyIndent* ind = pprint->indent + 0;
    if ( pprint->ixInd > 0 )
    {
        ind[0] = ind[1];
        InitIndent( &ind[1] );
    }

    if ( pprint->wraphere > 0 )
    {
        int wrap = (int) pprint->wraphere;
        if ( ind[0].attrStringStart > wrap )
            ind[0].attrStringStart -= wrap;
        if ( ind[0].attrValStart > wrap )
            ind[0].attrValStart -= wrap;
    }
    else
    {
        if ( ind[0].attrStringStart > 0 )
            ind[0].attrStringStart = 0;
        if ( ind[0].attrValStart > 0 )
            ind[0].attrValStart = 0;
    }
    pprint->wraphere = pprint->ixInd = 0;
}